

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

bool __thiscall Grid::slime(Grid *this,point p)

{
  cg_other *pcVar1;
  bool bVar2;
  cgo_char *d;
  int *piVar3;
  pointer pcVar4;
  
  bVar2 = cg_box::contains((this->box).ptr,p);
  if (bVar2) {
    piVar3 = cg_box::at((this->box).ptr,p);
LAB_0010dac8:
    bVar2 = (*piVar3 & this->SLIMEBIT) != 0;
  }
  else {
    pcVar1 = (this->other).ptr;
    for (pcVar4 = (pcVar1->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar4 != (pcVar1->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pcVar4 = pcVar4 + 1) {
      if (pcVar4->p == p) {
        piVar3 = &pcVar4->ch;
        goto LAB_0010dac8;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Grid::slime(point p) {
    if (box->contains(p)) return !!(box->at(p) & SLIMEBIT);
    for (auto &d: other->data) {
        if (d.p == p) return !!(d.ch & SLIMEBIT);
    }
    return false;
}